

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O0

int __thiscall CMU462::Timeline::previousImportantTime(Timeline *this)

{
  bool bVar1;
  reference piVar2;
  _Rb_tree_const_iterator<int> *in_RDI;
  iterator iter;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffffc8;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffffd8;
  _Self local_20;
  _Self local_18 [2];
  int local_4;
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::lower_bound
                 (in_stack_ffffffffffffffd8,(key_type *)in_RDI);
  local_20._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin(in_stack_ffffffffffffffc8);
  bVar1 = std::operator==(local_18,&local_20);
  if (bVar1) {
    local_4 = -1;
  }
  else {
    std::_Rb_tree_const_iterator<int>::operator--
              ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffffd8,
               (int)((ulong)in_RDI >> 0x20));
    piVar2 = std::_Rb_tree_const_iterator<int>::operator*(in_RDI);
    local_4 = *piVar2;
  }
  return local_4;
}

Assistant:

int Timeline::previousImportantTime() {
  // NOTE : lower bound returns an iter to next > or = element.
  set<int>::iterator iter = times.lower_bound(current_frame);

  if (iter == times.begin()) {
    return -1;
  }

  // Iteratres back one key frame.
  // It we are currently on a key frame,
  // then lower bound would have given us back current_frame.
  iter--;

  return *iter;
}